

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_kernel_2.h
# Opt level: O1

void __thiscall
dlib::
memory_manager_kernel_2<dlib::stack_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>_>::node,_10UL>
::~memory_manager_kernel_2
          (memory_manager_kernel_2<dlib::stack_kernel_1<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dlib::memory_manager_kernel_2<char,_10UL>_>::node,_10UL>
           *this)

{
  chunk_node *pcVar1;
  chunk_node *temp;
  
  this->_vptr_memory_manager_kernel_2 = (_func_int **)&PTR__memory_manager_kernel_2_00319d10;
  if (this->allocations == 0) {
    while (pcVar1 = this->first_chunk, pcVar1 != (chunk_node *)0x0) {
      this->first_chunk = pcVar1->next;
      operator_delete(pcVar1->chunk);
      operator_delete(pcVar1);
    }
  }
  return;
}

Assistant:

virtual ~memory_manager_kernel_2(
        )
        {
            if (allocations == 0)
            {
                while (first_chunk != 0)
                {
                    chunk_node* temp = first_chunk;
                    first_chunk = first_chunk->next;
                    // delete the memory chunk 
                    ::operator delete ( static_cast<void*>(temp->chunk));
                    // delete the chunk_node
                    delete temp;
                }
            }
        }